

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

ByteData256 * __thiscall
cfd::core::ConfidentialTxOut::GetWitnessHash
          (ByteData256 *__return_storage_ptr__,ConfidentialTxOut *this)

{
  ByteData256 local_c0;
  ByteData local_a8;
  ByteData256 local_90;
  ByteData local_68;
  ByteData256 local_50;
  undefined1 local_38 [8];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> leaves;
  ConfidentialTxOut *this_local;
  ByteData256 *result;
  
  leaves.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  ByteData256::ByteData256(__return_storage_ptr__);
  ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)local_38);
  ByteData::Serialize(&local_68,&this->surjection_proof_);
  HashUtil::Sha256D(&local_50,&local_68);
  ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::push_back
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)local_38,
             &local_50);
  ByteData256::~ByteData256(&local_50);
  ByteData::~ByteData(&local_68);
  ByteData::Serialize(&local_a8,&this->range_proof_);
  HashUtil::Sha256D(&local_90,&local_a8);
  ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::push_back
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)local_38,
             &local_90);
  ByteData256::~ByteData256(&local_90);
  ByteData::~ByteData(&local_a8);
  CryptoUtil::ComputeFastMerkleRoot
            (&local_c0,
             (vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)local_38);
  ByteData256::operator=(__return_storage_ptr__,&local_c0);
  ByteData256::~ByteData256(&local_c0);
  leaves.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)local_38);
  if ((leaves.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    ByteData256::~ByteData256(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteData256 ConfidentialTxOut::GetWitnessHash() const {
  ByteData256 result;
  std::vector<ByteData256> leaves;
  leaves.push_back(HashUtil::Sha256D(surjection_proof_.Serialize()));
  leaves.push_back(HashUtil::Sha256D(range_proof_.Serialize()));
  result = CryptoUtil::ComputeFastMerkleRoot(leaves);
  return result;
}